

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  lVar3 = 0;
  pbVar5 = (byte *)s;
  pbVar2 = (byte *)0x0;
LAB_00113e7e:
  bVar1 = *pbVar5;
  pbVar4 = pbVar5;
  if (((anonymous_namespace)::chartype_table[bVar1] & 1) == 0) {
    pbVar5 = pbVar5 + 2;
    do {
      pbVar4 = pbVar5;
      bVar1 = pbVar4[-1];
      if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) {
        pbVar4 = pbVar4 + -1;
        goto LAB_00113ed4;
      }
      bVar1 = *pbVar4;
      if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) goto LAB_00113ed4;
      bVar1 = pbVar4[1];
      if (((anonymous_namespace)::chartype_table[bVar1] & 1) != 0) {
        pbVar4 = pbVar4 + 1;
        goto LAB_00113ed4;
      }
      bVar1 = pbVar4[2];
      pbVar5 = pbVar4 + 4;
    } while (((anonymous_namespace)::chartype_table[bVar1] & 1) == 0);
    pbVar4 = pbVar4 + 2;
  }
LAB_00113ed4:
  if (bVar1 == 0xd) {
    pbVar5 = pbVar4 + 1;
    *pbVar4 = 10;
    if (pbVar4[1] == 10) {
      if (pbVar2 != (byte *)0x0) {
        memmove(pbVar2 + -lVar3,pbVar2,(long)pbVar5 - (long)pbVar2);
      }
      pbVar5 = pbVar4 + 2;
      lVar3 = lVar3 + 1;
      pbVar2 = pbVar5;
    }
    goto LAB_00113e7e;
  }
  if (bVar1 == 0) {
    pbVar5 = pbVar4;
    if (pbVar2 != (byte *)0x0) {
      memmove(pbVar2 + -lVar3,pbVar2,(long)pbVar4 - (long)pbVar2);
      pbVar5 = pbVar4 + -lVar3;
    }
    goto LAB_00113f8a;
  }
  if (bVar1 != 0x3c) {
    pbVar5 = pbVar4 + 1;
    goto LAB_00113e7e;
  }
  pbVar5 = pbVar4;
  if (pbVar2 != (byte *)0x0) {
    memmove(pbVar2 + -lVar3,pbVar2,(long)pbVar4 - (long)pbVar2);
    pbVar5 = pbVar4 + -lVar3;
  }
  do {
    pbVar2 = pbVar5;
    if (pbVar2 <= s) break;
    pbVar5 = pbVar2 + -1;
  } while (((anonymous_namespace)::chartype_table[pbVar2[-1]] & 8) != 0);
  *pbVar2 = 0;
  return (char_t *)(pbVar4 + 1);
  while (pbVar5 = pbVar2 + -1, ((anonymous_namespace)::chartype_table[pbVar2[-1]] & 8) != 0) {
LAB_00113f8a:
    pbVar2 = pbVar5;
    if (pbVar2 <= s) break;
  }
  *pbVar2 = 0;
  return (char_t *)pbVar4;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}